

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Property.hh
# Opt level: O0

size_t __thiscall
OpenMesh::PropertyT<OpenMesh::VectorT<unsigned_char,_3>_>::restore
          (PropertyT<OpenMesh::VectorT<unsigned_char,_3>_> *this,istream *_istr,bool _swap)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  reference _v;
  size_t sVar3;
  ulong local_38;
  size_t i;
  size_t bytes;
  bool _swap_local;
  istream *_istr_local;
  PropertyT<OpenMesh::VectorT<unsigned_char,_3>_> *this_local;
  
  bVar1 = IO::
          is_streamable<std::vector<OpenMesh::VectorT<unsigned_char,3>,std::allocator<OpenMesh::VectorT<unsigned_char,3>>>>
                    ();
  if (bVar1) {
    this_local = (PropertyT<OpenMesh::VectorT<unsigned_char,_3>_> *)
                 IO::
                 restore<std::vector<OpenMesh::VectorT<unsigned_char,3>,std::allocator<OpenMesh::VectorT<unsigned_char,3>>>>
                           (_istr,&this->data_,_swap);
  }
  else {
    i = 0;
    local_38 = 0;
    while( true ) {
      iVar2 = (*(this->super_BaseProperty)._vptr_BaseProperty[0xb])();
      if (CONCAT44(extraout_var,iVar2) <= local_38) break;
      _v = std::
           vector<OpenMesh::VectorT<unsigned_char,_3>,_std::allocator<OpenMesh::VectorT<unsigned_char,_3>_>_>
           ::operator[](&this->data_,local_38);
      sVar3 = IO::restore<OpenMesh::VectorT<unsigned_char,3>>(_istr,_v,_swap);
      i = sVar3 + i;
      local_38 = local_38 + 1;
    }
    this_local = (PropertyT<OpenMesh::VectorT<unsigned_char,_3>_> *)i;
  }
  return (size_t)this_local;
}

Assistant:

virtual size_t restore( std::istream& _istr, bool _swap )
  {
    if ( IO::is_streamable<vector_type>() )
      return IO::restore(_istr, data_, _swap );
    size_t bytes = 0;
    for (size_t i=0; i<n_elements(); ++i)
      bytes += IO::restore( _istr, data_[i], _swap );
    return bytes;
  }